

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

curltime cf_get_max_baller_time(Curl_cfilter *cf,Curl_easy *data,int query)

{
  Curl_cfilter *pCVar1;
  CURLcode CVar2;
  timediff_t tVar3;
  Curl_cfilter **ppCVar4;
  ulong uVar5;
  curltime cVar6;
  curltime newer;
  curltime older;
  curltime t;
  ulong local_58;
  time_t local_50;
  long local_48;
  uint uStack_40;
  undefined4 uStack_3c;
  
  if (*(long *)&cf[3].sockindex == 0) {
    local_58 = 0;
    local_50 = 0;
  }
  else {
    ppCVar4 = &cf[1].next;
    local_50 = 0;
    uVar5 = 0;
    local_58 = 0;
    do {
      pCVar1 = *ppCVar4;
      local_48 = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      if ((((pCVar1 != (Curl_cfilter *)0x0) &&
           (CVar2 = (*pCVar1->cft->query)(pCVar1,data,query,(int *)0x0,&local_48), CVar2 == CURLE_OK
           )) && (newer.tv_usec = uStack_40, newer.tv_sec = local_48,
                 uStack_40 != 0 || local_48 != 0)) &&
         (newer._12_4_ = 0, older._8_8_ = local_58, older.tv_sec = local_50,
         tVar3 = Curl_timediff_us(newer,older), 0 < tVar3)) {
        local_50 = local_48;
        local_58 = (ulong)uStack_40;
      }
      uVar5 = uVar5 + 1;
      ppCVar4 = ppCVar4 + 7;
    } while (uVar5 < *(ulong *)&cf[3].sockindex);
  }
  cVar6._8_8_ = local_58;
  cVar6.tv_sec = local_50;
  return cVar6;
}

Assistant:

static struct curltime cf_get_max_baller_time(struct Curl_cfilter *cf,
                                              struct Curl_easy *data,
                                              int query)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime t, tmax;
  size_t i;

  memset(&tmax, 0, sizeof(tmax));
  for(i = 0; i < ctx->baller_count; i++) {
    struct Curl_cfilter *cfb = ctx->ballers[i].cf;
    memset(&t, 0, sizeof(t));
    if(cfb && !cfb->cft->query(cfb, data, query, NULL, &t)) {
      if((t.tv_sec || t.tv_usec) && Curl_timediff_us(t, tmax) > 0)
        tmax = t;
    }
  }
  return tmax;
}